

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::PrefixModeStorage::PrefixModeStorage
          (PrefixModeStorage *this)

{
  bool bVar1;
  char *pcVar2;
  char *prefix;
  char *exception_path;
  PrefixModeStorage *this_local;
  
  absl::lts_20250127::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map(&this->package_to_prefix_map_);
  std::__cxx11::string::string((string *)&this->package_to_prefix_mappings_path_);
  std::__cxx11::string::string((string *)&this->exception_path_);
  std::__cxx11::string::string((string *)&this->forced_prefix_);
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flat_hash_set(&this->exceptions_);
  bVar1 = BoolFromEnvVar("GPB_OBJC_USE_PACKAGE_AS_PREFIX",false);
  this->use_package_name_ = bVar1;
  pcVar2 = getenv("GPB_OBJC_PACKAGE_PREFIX_EXCEPTIONS_PATH");
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->exception_path_,pcVar2);
  }
  pcVar2 = getenv("GPB_OBJC_USE_PACKAGE_AS_PREFIX_PREFIX");
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->forced_prefix_,pcVar2);
  }
  return;
}

Assistant:

PrefixModeStorage::PrefixModeStorage() {
  // Even thought there are generation options, have an env back door since some
  // of these helpers could be used in other plugins.

  use_package_name_ = BoolFromEnvVar("GPB_OBJC_USE_PACKAGE_AS_PREFIX", false);

  const char* exception_path =
      getenv("GPB_OBJC_PACKAGE_PREFIX_EXCEPTIONS_PATH");
  if (exception_path) {
    exception_path_ = exception_path;
  }

  const char* prefix = getenv("GPB_OBJC_USE_PACKAGE_AS_PREFIX_PREFIX");
  if (prefix) {
    forced_prefix_ = prefix;
  }
}